

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridWavelet.cpp
# Opt level: O3

void __thiscall
TasGrid::GridWavelet::addChild(GridWavelet *this,int *point,int direction,Data2D<int> *destination)

{
  int iVar1;
  int L;
  int R;
  vector<int,_std::allocator<int>_> kid;
  int local_48;
  int local_44;
  int *local_40 [2];
  long local_30;
  
  ::std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)local_40,point,
             point + (this->super_BaseCanonicalGrid).num_dimensions,(allocator_type *)&local_48);
  RuleWavelet::getChildren(&this->rule1D,point[direction],&local_48,&local_44);
  local_40[0][direction] = local_48;
  if ((local_48 != -1) &&
     (iVar1 = MultiIndexSet::getSlot(&(this->super_BaseCanonicalGrid).points,local_40[0]),
     iVar1 == -1)) {
    ::std::vector<int,std::allocator<int>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
              ((vector<int,std::allocator<int>> *)&destination->vec,
               (destination->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_40[0],local_40[0] + destination->stride);
    destination->num_strips = destination->num_strips + 1;
  }
  local_40[0][direction] = local_44;
  if (local_44 != -1) {
    iVar1 = MultiIndexSet::getSlot(&(this->super_BaseCanonicalGrid).points,local_40[0]);
    if (iVar1 == -1) {
      ::std::vector<int,std::allocator<int>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                ((vector<int,std::allocator<int>> *)&destination->vec,
                 (destination->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,local_40[0],local_40[0] + destination->stride);
      destination->num_strips = destination->num_strips + 1;
    }
    if (local_40[0] == (int *)0x0) {
      return;
    }
  }
  operator_delete(local_40[0],local_30 - (long)local_40[0]);
  return;
}

Assistant:

void GridWavelet::addChild(const int point[], int direction, Data2D<int> &destination) const{
    std::vector<int> kid(point, point + num_dimensions);
    int L, R; rule1D.getChildren(point[direction], L, R);
    kid[direction] = L;
    if ((kid[direction] != -1) && points.missing(kid)){
        destination.appendStrip(kid);
    }
    kid[direction] = R;
    if ((kid[direction] != -1) && points.missing(kid)){
        destination.appendStrip(kid);
}
}